

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::~ImFont(ImFont *this)

{
  unsigned_short *ptr;
  float *ptr_00;
  ImFontGlyph *ptr_01;
  
  ClearOutputData(this);
  ptr = (this->IndexLookup).Data;
  if (ptr != (unsigned_short *)0x0) {
    ImGui::MemFree(ptr);
  }
  ptr_00 = (this->IndexAdvanceX).Data;
  if (ptr_00 != (float *)0x0) {
    ImGui::MemFree(ptr_00);
  }
  ptr_01 = (this->Glyphs).Data;
  if (ptr_01 != (ImFontGlyph *)0x0) {
    ImGui::MemFree(ptr_01);
  }
  return;
}

Assistant:

ImFont::~ImFont()
{
    // Invalidate active font so that the user gets a clear crash instead of a dangling pointer.
    // If you want to delete fonts you need to do it between Render() and NewFrame().
    // FIXME-CLEANUP
    /*
    ImGuiContext& g = *GImGui;
    if (g.Font == this)
        g.Font = NULL;
    */
    ClearOutputData();
}